

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O3

uint64_t fio_risky_hash(void *data_,size_t len,uint64_t seed)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  uVar2 = len ^ 0xab137439982b86c9;
  lVar1 = -0x54ec8bc667d47938 - len;
  uVar6 = (len << 0x11 | len >> 0x2f) ^ 0x50a6cb67c2f68a71;
  uVar5 = (len << 0x21 | len >> 0x1f) + 0x54ec8bc667d47936;
  lVar10 = 0;
  do {
    uVar8 = *(ulong *)((long)data_ + lVar10);
    uVar3 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    uVar2 = uVar2 + uVar3;
    uVar8 = *(ulong *)((long)data_ + lVar10 + 8);
    uVar7 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    uVar2 = ((uVar2 << 0x21 | uVar2 >> 0x1f) + uVar3) * -0x445c05ea4ddeec5;
    uVar3 = lVar1 + uVar7;
    uVar8 = *(ulong *)((long)data_ + lVar10 + 0x10);
    uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    lVar1 = ((uVar3 << 0x21 | uVar3 >> 0x1f) + uVar7) * -0x445c05ea4ddeec5;
    uVar6 = uVar6 + uVar8;
    lVar4 = (uVar6 << 0x21 | uVar6 >> 0x1f) + uVar8;
    uVar6 = lVar4 * -0x445c05ea4ddeec5;
    uVar8 = *(ulong *)((long)data_ + lVar10 + 0x18);
    uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    uVar5 = uVar5 + uVar8;
    lVar9 = (uVar5 << 0x21 | uVar5 >> 0x1f) + uVar8;
    uVar5 = lVar9 * -0x445c05ea4ddeec5;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x80);
  uVar8 = *(ulong *)((long)data_ + 0x80);
  uVar3 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
          (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar8 = *(ulong *)((long)data_ + 0x88);
  uVar2 = uVar2 + uVar3;
  lVar10 = (uVar2 << 0x21 | uVar2 >> 0x1f) + uVar3;
  uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
          (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar2 = lVar1 + uVar8;
  lVar1 = (uVar2 << 0x21 | uVar2 >> 0x1f) + uVar8;
  uVar2 = lVar10 * -0x7536c3408ddc96ad + ((ulong)(lVar10 * -0x445c05ea4ddeec5) >> 0x2f) +
          (uVar5 << 0x39 | uVar5 >> 7) + (uVar6 << 0x2f | uVar6 >> 0x11) +
          lVar1 * 0x47f42b6442276000 + ((ulong)(lVar1 * -0x445c05ea4ddeec5) >> 0x33) + 0x12000000090
  ;
  uVar2 = lVar1 * 0xb86867b4fad6953 + ((uVar2 * 0x2000 | uVar2 >> 0x33) ^ uVar2);
  uVar2 = lVar4 * 0xb86867b4fad6953 + ((uVar2 * 0x20000000 | uVar2 >> 0x23) ^ uVar2);
  uVar2 = lVar9 * 0xb86867b4fad6953 + ((uVar2 << 0x21 | uVar2 >> 0x1f) ^ uVar2);
  uVar2 = (uVar2 << 0x33 | uVar2 >> 0xd) ^ uVar2;
  return (uVar2 >> 0x1d) * -0x445c05ea4ddeec5 ^ uVar2;
}

Assistant:

FIO_FUNC inline uint64_t fio_risky_hash(const void *data_, size_t len,
                                        uint64_t seed) {
  /* reading position */
  const uint8_t *data = (uint8_t *)data_;

  /* The consumption vectors initialized state */
  register uint64_t v0 = seed ^ RISKY_PRIME_1;
  register uint64_t v1 = ~seed + RISKY_PRIME_1;
  register uint64_t v2 =
      fio_lrot64(seed, 17) ^ ((~RISKY_PRIME_1) + RISKY_PRIME_0);
  register uint64_t v3 = fio_lrot64(seed, 33) + (~RISKY_PRIME_1);

  /* consume 256 bit blocks */
  for (size_t i = len >> 5; i; --i) {
    fio_risky_consume(v0, fio_str2u64(data));
    fio_risky_consume(v1, fio_str2u64(data + 8));
    fio_risky_consume(v2, fio_str2u64(data + 16));
    fio_risky_consume(v3, fio_str2u64(data + 24));
    data += 32;
  }

  /* Consume any remaining 64 bit words. */
  switch (len & 24) {
  case 24:
    fio_risky_consume(v2, fio_str2u64(data + 16));
    /* fallthrough */
  case 16:
    fio_risky_consume(v1, fio_str2u64(data + 8));
    /* fallthrough */
  case 8:
    fio_risky_consume(v0, fio_str2u64(data));
    data += len & 24;
  }

  uint64_t tmp = 0;
  /* consume leftover bytes, if any */
  switch ((len & 7)) {
  case 7:
    tmp |= ((uint64_t)data[6]) << 8;
    /* fallthrough */
  case 6:
    tmp |= ((uint64_t)data[5]) << 16;
    /* fallthrough */
  case 5:
    tmp |= ((uint64_t)data[4]) << 24;
    /* fallthrough */
  case 4:
    tmp |= ((uint64_t)data[3]) << 32;
    /* fallthrough */
  case 3:
    tmp |= ((uint64_t)data[2]) << 40;
    /* fallthrough */
  case 2:
    tmp |= ((uint64_t)data[1]) << 48;
    /* fallthrough */
  case 1:
    tmp |= ((uint64_t)data[0]) << 56;
    /* ((len >> 3) & 3) is a 0...3 value indicating consumption vector */
    switch ((len >> 3) & 3) {
    case 3:
      fio_risky_consume(v3, tmp);
      break;
    case 2:
      fio_risky_consume(v2, tmp);
      break;
    case 1:
      fio_risky_consume(v1, tmp);
      break;
    case 0:
      fio_risky_consume(v0, tmp);
      break;
    }
  }

  /* merge and mix */
  uint64_t result = fio_lrot64(v0, 17) + fio_lrot64(v1, 13) +
                    fio_lrot64(v2, 47) + fio_lrot64(v3, 57);

  len ^= (len << 33);
  result += len;

  result += v0 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 13);
  result += v1 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 29);
  result += v2 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 33);
  result += v3 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 51);

  /* irreversible avalanche... I think */
  result ^= (result >> 29) * RISKY_PRIME_0;
  return result;
}